

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OctreeTracer.cpp
# Opt level: O3

void __thiscall
OctreeTracer::create_main_graphics_pipeline
          (OctreeTracer *this,shared_ptr<myvk::RenderPass> *render_pass,uint32_t subpass)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  ShaderModule *this_01;
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 this_02;
  int iVar3;
  undefined4 extraout_var;
  initializer_list<VkPipelineShaderStageCreateInfo> __l;
  initializer_list<VkDynamicState> __l_00;
  shared_ptr<myvk::Device> device;
  vector<VkPipelineShaderStageCreateInfo,_std::allocator<VkPipelineShaderStageCreateInfo>_>
  shader_stages;
  uint32_t kOctreeTracerFragSpv [3713];
  allocator_type local_3d21;
  element_type *local_3d20;
  undefined1 local_3d18 [56];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_3ce0;
  VkDynamicState local_3cd8 [2];
  undefined1 local_3cd0 [24];
  element_type *local_3cb8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_3cb0;
  VkSpecializationInfo *local_3ca8;
  undefined1 auStack_3ca0 [16];
  VertexInputState local_3c90;
  InputAssemblyState local_3c28;
  VkStructureType local_3c00;
  void *local_3bf8;
  undefined8 uStack_3bf0;
  bool local_3be8;
  ViewportState local_3be0;
  MultisampleState local_3b78;
  VkStructureType local_3b40;
  void *local_3b38;
  undefined8 uStack_3b30;
  undefined8 local_3b28;
  undefined8 uStack_3b20;
  undefined1 local_3b18 [32];
  undefined8 local_3af8;
  undefined8 uStack_3af0;
  undefined8 local_3ae8;
  undefined8 uStack_3ae0;
  bool local_3ad8;
  ColorBlendState local_3ad0;
  DynamicState local_3a78;
  uint32_t local_3a38 [3714];
  
  memcpy(local_3a38,&DAT_00235ed0,0x3a04);
  iVar3 = (*(((render_pass->super___shared_ptr<myvk::RenderPass,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
             )->super_DeviceObjectBase).super_Base._vptr_Base[2])();
  local_3d18._24_8_ = *(undefined8 *)CONCAT44(extraout_var,iVar3);
  local_3d18._32_8_ = ((undefined8 *)CONCAT44(extraout_var,iVar3))[1];
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_3d18._32_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_3d18._32_8_)->_M_use_count =
           ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_3d18._32_8_)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_3d18._32_8_)->_M_use_count =
           ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_3d18._32_8_)->_M_use_count + 1;
    }
  }
  myvk::ShaderModule::Create
            ((ShaderModule *)local_3cd0,(Ptr<Device> *)(local_3d18 + 0x18),kQuadVertSpv,0x354);
  this_01 = (ShaderModule *)CONCAT44(local_3cd0._4_4_,local_3cd0._0_4_);
  local_3d20 = (element_type *)local_3cd0._8_8_;
  myvk::ShaderModule::Create
            ((ShaderModule *)local_3cd0,(Ptr<Device> *)(local_3d18 + 0x18),local_3a38,0x3a04);
  this_02 = local_3cd0._8_8_;
  myvk::ShaderModule::GetPipelineShaderStageCreateInfo
            ((VkPipelineShaderStageCreateInfo *)local_3cd0,this_01,VK_SHADER_STAGE_VERTEX_BIT,
             (VkSpecializationInfo *)0x0);
  myvk::ShaderModule::GetPipelineShaderStageCreateInfo
            ((VkPipelineShaderStageCreateInfo *)auStack_3ca0,
             (ShaderModule *)CONCAT44(local_3cd0._4_4_,local_3cd0._0_4_),
             VK_SHADER_STAGE_FRAGMENT_BIT,(VkSpecializationInfo *)0x0);
  __l._M_len = 2;
  __l._M_array = (iterator)local_3cd0;
  std::vector<VkPipelineShaderStageCreateInfo,_std::allocator<VkPipelineShaderStageCreateInfo>_>::
  vector((vector<VkPipelineShaderStageCreateInfo,_std::allocator<VkPipelineShaderStageCreateInfo>_>
          *)(local_3d18 + 0x28),__l,(allocator_type *)local_3d18);
  local_3cd0._0_4_ = VK_STRUCTURE_TYPE_PIPELINE_RASTERIZATION_STATE_CREATE_INFO;
  local_3cd0._8_8_ = (element_type *)0x0;
  local_3cd0._16_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_3cb8 = (element_type *)0x0;
  _Stack_3cb0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_3ca8 = (VkSpecializationInfo *)0x0;
  auStack_3ca0._0_8_ = 0;
  auStack_3ca0._8_4_ = 0.0;
  local_3c90.m_bindings.
  super__Vector_base<VkVertexInputBindingDescription,_std::allocator<VkVertexInputBindingDescription>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_3c90.m_bindings.
  super__Vector_base<VkVertexInputBindingDescription,_std::allocator<VkVertexInputBindingDescription>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_3c90.m_bindings.
  super__Vector_base<VkVertexInputBindingDescription,_std::allocator<VkVertexInputBindingDescription>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_3c90.m_attributes.
  super__Vector_base<VkVertexInputAttributeDescription,_std::allocator<VkVertexInputAttributeDescription>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_3c90.m_attributes.
  super__Vector_base<VkVertexInputAttributeDescription,_std::allocator<VkVertexInputAttributeDescription>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_3c90.m_attributes.
  super__Vector_base<VkVertexInputAttributeDescription,_std::allocator<VkVertexInputAttributeDescription>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_3c90.m_create_info.sType = VK_STRUCTURE_TYPE_PIPELINE_VERTEX_INPUT_STATE_CREATE_INFO;
  local_3c90.m_create_info.pVertexAttributeDescriptions = (VkVertexInputAttributeDescription *)0x0;
  local_3c90.m_enable = false;
  local_3c90.m_create_info.pNext = (void *)0x0;
  local_3c90.m_create_info.flags = 0;
  local_3c90.m_create_info.vertexBindingDescriptionCount = 0;
  local_3c90.m_create_info.pVertexBindingDescriptions._0_4_ = 0;
  local_3c90.m_create_info._28_8_ = 0;
  local_3c28.m_create_info.sType = VK_STRUCTURE_TYPE_PIPELINE_INPUT_ASSEMBLY_STATE_CREATE_INFO;
  local_3c28.m_enable = false;
  local_3c28.m_create_info.pNext = (void *)0x0;
  local_3c28.m_create_info.flags = 0;
  local_3c28.m_create_info.topology = VK_PRIMITIVE_TOPOLOGY_POINT_LIST;
  local_3c28.m_create_info.primitiveRestartEnable = 0;
  local_3c00 = VK_STRUCTURE_TYPE_PIPELINE_TESSELLATION_STATE_CREATE_INFO;
  local_3be8 = false;
  local_3bf8 = (void *)0x0;
  uStack_3bf0._0_4_ = 0;
  uStack_3bf0._4_4_ = 0;
  local_3be0.m_scissors.super__Vector_base<VkRect2D,_std::allocator<VkRect2D>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_3be0.m_scissors.super__Vector_base<VkRect2D,_std::allocator<VkRect2D>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_3be0.m_viewports.super__Vector_base<VkViewport,_std::allocator<VkViewport>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_3be0.m_scissors.super__Vector_base<VkRect2D,_std::allocator<VkRect2D>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_3be0.m_viewports.super__Vector_base<VkViewport,_std::allocator<VkViewport>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_3be0.m_viewports.super__Vector_base<VkViewport,_std::allocator<VkViewport>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_3be0.m_create_info.sType = VK_STRUCTURE_TYPE_PIPELINE_VIEWPORT_STATE_CREATE_INFO;
  local_3be0.m_create_info.pScissors = (VkRect2D *)0x0;
  local_3be0.m_enable = false;
  local_3be0.m_create_info.pNext = (void *)0x0;
  local_3be0.m_create_info.flags = 0;
  local_3be0.m_create_info.viewportCount = 0;
  local_3be0.m_create_info.pViewports._0_4_ = 0;
  local_3be0.m_create_info._28_8_ = 0;
  local_3b78.m_create_info.sType = VK_STRUCTURE_TYPE_PIPELINE_MULTISAMPLE_STATE_CREATE_INFO;
  local_3b78.m_create_info.alphaToCoverageEnable._0_1_ = 0;
  local_3b78._41_8_ = 0;
  local_3b78.m_create_info.sampleShadingEnable = 0;
  local_3b78.m_create_info.minSampleShading = 0.0;
  local_3b78.m_create_info.pSampleMask._0_1_ = 0;
  local_3b78.m_create_info.pSampleMask._1_7_ = 0;
  local_3b78.m_create_info.pNext = (void *)0x0;
  local_3b78.m_create_info.flags = 0;
  local_3b78.m_create_info.rasterizationSamples = 0;
  local_3b40 = VK_STRUCTURE_TYPE_PIPELINE_DEPTH_STENCIL_STATE_CREATE_INFO;
  local_3b38 = (void *)0x0;
  uStack_3b30._0_4_ = 0;
  uStack_3b30._4_4_ = 0;
  local_3b28._0_4_ = 0;
  local_3b28._4_4_ = VK_COMPARE_OP_NEVER;
  uStack_3b20._0_4_ = 0;
  uStack_3b20._4_4_ = 0;
  local_3b18._0_4_ = VK_STENCIL_OP_KEEP;
  local_3b18._4_4_ = VK_STENCIL_OP_KEEP;
  local_3b18._8_4_ = VK_STENCIL_OP_KEEP;
  local_3b18._12_4_ = VK_COMPARE_OP_NEVER;
  local_3b18._16_4_ = 0;
  local_3b18._20_4_ = 0;
  local_3b18._24_4_ = 0;
  local_3b18._28_4_ = VK_STENCIL_OP_KEEP;
  local_3af8._0_4_ = VK_STENCIL_OP_KEEP;
  local_3af8._4_4_ = VK_STENCIL_OP_KEEP;
  uStack_3af0._0_4_ = VK_COMPARE_OP_NEVER;
  uStack_3af0._4_4_ = 0;
  local_3ae8._0_4_ = 0;
  local_3ae8._4_4_ = 0;
  uStack_3ae0._0_4_ = 0.0;
  uStack_3ae0._4_4_ = 0.0;
  local_3ad8 = false;
  local_3ad0.m_color_blend_attachments.
  super__Vector_base<VkPipelineColorBlendAttachmentState,_std::allocator<VkPipelineColorBlendAttachmentState>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_3ad0.m_color_blend_attachments.
  super__Vector_base<VkPipelineColorBlendAttachmentState,_std::allocator<VkPipelineColorBlendAttachmentState>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_3ad0.m_color_blend_attachments.
  super__Vector_base<VkPipelineColorBlendAttachmentState,_std::allocator<VkPipelineColorBlendAttachmentState>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_3ad0.m_create_info.sType = VK_STRUCTURE_TYPE_PIPELINE_COLOR_BLEND_STATE_CREATE_INFO;
  local_3ad0.m_enable = false;
  local_3ad0.m_create_info.blendConstants[0] = 0.0;
  local_3ad0.m_create_info.blendConstants[1] = 0.0;
  local_3ad0.m_create_info.blendConstants[2] = 0.0;
  local_3ad0.m_create_info.blendConstants[3] = 0.0;
  local_3ad0.m_create_info.logicOp = VK_LOGIC_OP_CLEAR;
  local_3ad0.m_create_info.attachmentCount = 0;
  local_3ad0.m_create_info.pAttachments = (VkPipelineColorBlendAttachmentState *)0x0;
  local_3ad0.m_create_info.pNext = (void *)0x0;
  local_3ad0.m_create_info.flags = 0;
  local_3ad0.m_create_info.logicOpEnable = 0;
  local_3a78.m_dynamic_states.super__Vector_base<VkDynamicState,_std::allocator<VkDynamicState>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_3a78.m_dynamic_states.super__Vector_base<VkDynamicState,_std::allocator<VkDynamicState>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_3a78.m_dynamic_states.super__Vector_base<VkDynamicState,_std::allocator<VkDynamicState>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_3a78.m_create_info.sType = VK_STRUCTURE_TYPE_PIPELINE_DYNAMIC_STATE_CREATE_INFO;
  local_3a78.m_create_info.pDynamicStates._0_1_ = 0;
  local_3a78._49_8_ = 0;
  local_3a78.m_create_info.pNext = (void *)0x0;
  local_3a78.m_create_info.flags._0_1_ = 0;
  local_3a78.m_create_info._17_7_ = 0;
  myvk::GraphicsPipelineState::VertexInputState::Enable(&local_3c90);
  myvk::GraphicsPipelineState::InputAssemblyState::Enable
            (&local_3c28,VK_PRIMITIVE_TOPOLOGY_TRIANGLE_LIST,0);
  myvk::GraphicsPipelineState::ViewportState::Enable(&local_3be0,1,1);
  myvk::GraphicsPipelineState::RasterizationState::Initialize
            ((RasterizationState *)local_3cd0,VK_POLYGON_MODE_FILL,VK_FRONT_FACE_COUNTER_CLOCKWISE,1
            );
  myvk::GraphicsPipelineState::MultisampleState::Enable(&local_3b78,VK_SAMPLE_COUNT_1_BIT);
  myvk::GraphicsPipelineState::ColorBlendState::Enable(&local_3ad0,1,0);
  local_3cd8[0] = VK_DYNAMIC_STATE_VIEWPORT;
  local_3cd8[1] = VK_DYNAMIC_STATE_SCISSOR;
  __l_00._M_len = 2;
  __l_00._M_array = local_3cd8;
  std::vector<VkDynamicState,_std::allocator<VkDynamicState>_>::vector
            ((vector<VkDynamicState,_std::allocator<VkDynamicState>_> *)local_3d18,__l_00,
             &local_3d21);
  myvk::GraphicsPipelineState::DynamicState::Enable
            (&local_3a78,(vector<VkDynamicState,_std::allocator<VkDynamicState>_> *)local_3d18);
  if ((element_type *)local_3d18._0_8_ != (element_type *)0x0) {
    operator_delete((void *)local_3d18._0_8_,local_3d18._16_8_ - local_3d18._0_8_);
  }
  myvk::GraphicsPipeline::Create
            ((GraphicsPipeline *)local_3d18,&this->m_main_pipeline_layout,render_pass,
             (vector<VkPipelineShaderStageCreateInfo,_std::allocator<VkPipelineShaderStageCreateInfo>_>
              *)(local_3d18 + 0x28),(GraphicsPipelineState *)local_3cd0,subpass);
  uVar2 = local_3d18._8_8_;
  uVar1 = local_3d18._0_8_;
  local_3d18._0_8_ = (_func_int **)0x0;
  local_3d18._8_8_ = (element_type *)0x0;
  this_00 = (this->m_main_graphics_pipeline).
            super___shared_ptr<myvk::GraphicsPipeline,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
  ;
  (this->m_main_graphics_pipeline).
  super___shared_ptr<myvk::GraphicsPipeline,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)uVar1;
  (this->m_main_graphics_pipeline).
  super___shared_ptr<myvk::GraphicsPipeline,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar2;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
    if ((element_type *)local_3d18._8_8_ != (element_type *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_3d18._8_8_);
    }
  }
  if (local_3a78.m_dynamic_states.
      super__Vector_base<VkDynamicState,_std::allocator<VkDynamicState>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_3a78.m_dynamic_states.
                    super__Vector_base<VkDynamicState,_std::allocator<VkDynamicState>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_3a78.m_dynamic_states.
                          super__Vector_base<VkDynamicState,_std::allocator<VkDynamicState>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_3a78.m_dynamic_states.
                          super__Vector_base<VkDynamicState,_std::allocator<VkDynamicState>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_3ad0.m_color_blend_attachments.
      super__Vector_base<VkPipelineColorBlendAttachmentState,_std::allocator<VkPipelineColorBlendAttachmentState>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_3ad0.m_color_blend_attachments.
                    super__Vector_base<VkPipelineColorBlendAttachmentState,_std::allocator<VkPipelineColorBlendAttachmentState>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_3ad0.m_color_blend_attachments.
                          super__Vector_base<VkPipelineColorBlendAttachmentState,_std::allocator<VkPipelineColorBlendAttachmentState>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_3ad0.m_color_blend_attachments.
                          super__Vector_base<VkPipelineColorBlendAttachmentState,_std::allocator<VkPipelineColorBlendAttachmentState>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_3be0.m_scissors.super__Vector_base<VkRect2D,_std::allocator<VkRect2D>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_3be0.m_scissors.super__Vector_base<VkRect2D,_std::allocator<VkRect2D>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_3be0.m_scissors.
                          super__Vector_base<VkRect2D,_std::allocator<VkRect2D>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_3be0.m_scissors.
                          super__Vector_base<VkRect2D,_std::allocator<VkRect2D>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_3be0.m_viewports.super__Vector_base<VkViewport,_std::allocator<VkViewport>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_3be0.m_viewports.
                    super__Vector_base<VkViewport,_std::allocator<VkViewport>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_3be0.m_viewports.
                          super__Vector_base<VkViewport,_std::allocator<VkViewport>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_3be0.m_viewports.
                          super__Vector_base<VkViewport,_std::allocator<VkViewport>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if ((VkSpecializationInfo *)
      local_3c90.m_attributes.
      super__Vector_base<VkVertexInputAttributeDescription,_std::allocator<VkVertexInputAttributeDescription>_>
      ._M_impl.super__Vector_impl_data._M_start != (VkSpecializationInfo *)0x0) {
    operator_delete(local_3c90.m_attributes.
                    super__Vector_base<VkVertexInputAttributeDescription,_std::allocator<VkVertexInputAttributeDescription>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_3c90.m_attributes.
                          super__Vector_base<VkVertexInputAttributeDescription,_std::allocator<VkVertexInputAttributeDescription>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_3c90.m_attributes.
                          super__Vector_base<VkVertexInputAttributeDescription,_std::allocator<VkVertexInputAttributeDescription>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_3c90.m_bindings.
      super__Vector_base<VkVertexInputBindingDescription,_std::allocator<VkVertexInputBindingDescription>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_3c90.m_bindings.
                    super__Vector_base<VkVertexInputBindingDescription,_std::allocator<VkVertexInputBindingDescription>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_3c90.m_bindings.
                          super__Vector_base<VkVertexInputBindingDescription,_std::allocator<VkVertexInputBindingDescription>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_3c90.m_bindings.
                          super__Vector_base<VkVertexInputBindingDescription,_std::allocator<VkVertexInputBindingDescription>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if ((VkPipeline)local_3d18._40_8_ != (VkPipeline)0x0) {
    operator_delete((void *)local_3d18._40_8_,(long)local_3ce0._M_pi - local_3d18._40_8_);
  }
  if ((element_type *)this_02 != (element_type *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_02);
  }
  if (local_3d20 != (element_type *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_3d20);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_3d18._32_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_3d18._32_8_);
  }
  return;
}

Assistant:

void OctreeTracer::create_main_graphics_pipeline(const std::shared_ptr<myvk::RenderPass> &render_pass,
                                                 uint32_t subpass) {
	constexpr uint32_t kOctreeTracerFragSpv[] = {
#include "spirv/octree_tracer.frag.u32"
	};
	std::shared_ptr<myvk::Device> device = render_pass->GetDevicePtr();

	std::shared_ptr<myvk::ShaderModule> vert_shader_module, frag_shader_module;
	vert_shader_module = myvk::ShaderModule::Create(device, kQuadVertSpv, sizeof(kQuadVertSpv));
	frag_shader_module = myvk::ShaderModule::Create(device, kOctreeTracerFragSpv, sizeof(kOctreeTracerFragSpv));

	std::vector<VkPipelineShaderStageCreateInfo> shader_stages = {
	    vert_shader_module->GetPipelineShaderStageCreateInfo(VK_SHADER_STAGE_VERTEX_BIT),
	    frag_shader_module->GetPipelineShaderStageCreateInfo(VK_SHADER_STAGE_FRAGMENT_BIT)};

	myvk::GraphicsPipelineState pipeline_state = {};
	pipeline_state.m_vertex_input_state.Enable();
	pipeline_state.m_input_assembly_state.Enable(VK_PRIMITIVE_TOPOLOGY_TRIANGLE_LIST);
	pipeline_state.m_viewport_state.Enable(1, 1);
	pipeline_state.m_rasterization_state.Initialize(VK_POLYGON_MODE_FILL, VK_FRONT_FACE_COUNTER_CLOCKWISE,
	                                                VK_CULL_MODE_FRONT_BIT);
	pipeline_state.m_multisample_state.Enable(VK_SAMPLE_COUNT_1_BIT);
	pipeline_state.m_color_blend_state.Enable(1, VK_FALSE);
	pipeline_state.m_dynamic_state.Enable({VK_DYNAMIC_STATE_VIEWPORT, VK_DYNAMIC_STATE_SCISSOR});

	m_main_graphics_pipeline =
	    myvk::GraphicsPipeline::Create(m_main_pipeline_layout, render_pass, shader_stages, pipeline_state, subpass);
}